

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void output_module_primary_report
               (string *module,output_format out_fmt,bool track_sources,bool track_tests)

{
  module_primary_html_actions actions;
  module_primary_csv_actions local_38;
  
  if (out_fmt == output_format_csv) {
    local_38.module_._M_dataplus._M_p = (pointer)&local_38.module_.field_2;
    local_38.super_module_primary_actions._vptr_module_primary_actions =
         (_func_int **)&PTR_heading_0011e170;
    local_38.module_._M_string_length = 0;
    local_38.module_.field_2._M_local_buf[0] = '\0';
    output_module_primary_report
              (module,&local_38.super_module_primary_actions,track_sources,track_tests);
    module_primary_csv_actions::~module_primary_csv_actions(&local_38);
  }
  else {
    if (out_fmt == output_format_html) {
      local_38.super_module_primary_actions._vptr_module_primary_actions =
           (_func_int **)&PTR_heading_0011dfc8;
    }
    else {
      local_38.super_module_primary_actions._vptr_module_primary_actions =
           (_func_int **)&PTR_heading_0011e1d0;
    }
    output_module_primary_report
              (module,&local_38.super_module_primary_actions,track_sources,track_tests);
  }
  return;
}

Assistant:

static void output_module_primary_report( std::string const & module, output_format out_fmt, bool track_sources, bool track_tests )
{
    if( out_fmt == output_format_html )
    {
        module_primary_html_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
    else if( out_fmt == output_format_csv )
    {
        module_primary_csv_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
    else
    {
        module_primary_txt_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
}